

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::JSONParser::ParseF64Value
          (JSONParser *this,uint64_t *out_value,ExpectedNan *out_nan,string_view value_str,
          AllowExpected allow_expected)

{
  Result RVar1;
  size_t sVar2;
  Enum EVar3;
  long *s;
  
  s = (long *)value_str._M_str;
  sVar2 = value_str._M_len;
  if (allow_expected == Yes) {
    *out_value = 0;
    if (sVar2 == 0xe) {
      if (*(long *)((long)s + 6) != 0x636974656d687469 || *s != 0x746972613a6e616e)
      goto LAB_00121e9e;
      *out_nan = Arithmetic;
    }
    else {
      if ((sVar2 != 0xd) ||
         (*(long *)((long)s + 5) != 0x6c6163696e6f6e61 || *s != 0x6f6e61633a6e616e))
      goto LAB_00121e9e;
      *out_nan = Canonical;
    }
    EVar3 = Ok;
  }
  else {
LAB_00121e9e:
    *out_nan = None;
    EVar3 = Ok;
    RVar1 = wabt::ParseInt64((char *)s,(char *)(sVar2 + (long)s),out_value,UnsignedOnly);
    if (RVar1.enum_ == Error) {
      PrintError(this,"invalid f64 literal");
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

wabt::Result JSONParser::ParseF64Value(uint64_t* out_value,
                                       ExpectedNan* out_nan,
                                       std::string_view value_str,
                                       AllowExpected allow_expected) {
  if (allow_expected == AllowExpected::Yes) {
    *out_value = 0;
    if (value_str == "nan:canonical") {
      *out_nan = ExpectedNan::Canonical;
      return wabt::Result::Ok;
    } else if (value_str == "nan:arithmetic") {
      *out_nan = ExpectedNan::Arithmetic;
      return wabt::Result::Ok;
    }
  }

  *out_nan = ExpectedNan::None;
  if (Failed(ParseInt64(value_str, out_value, ParseIntType::UnsignedOnly))) {
    PrintError("invalid f64 literal");
    return wabt::Result::Error;
  }
  return wabt::Result::Ok;
}